

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_serial.cpp
# Opt level: O0

int SerialGetMode(int port)

{
  int iVar1;
  int local_74;
  int fd;
  int ret;
  int mode;
  char device [80];
  int local_c;
  int port_local;
  
  local_74 = FindFD(port);
  if (local_74 < 0) {
    sprintf((char *)&ret,"/dev/ttyM%d",(ulong)(uint)port);
    printf("SerialGetMode device=%s\n",&ret);
    local_74 = open((char *)&ret,0x102);
    if (local_74 < 0) {
      return -2;
    }
  }
  local_c = ioctl(local_74,0x443,&fd);
  iVar1 = FindFD(port);
  if (iVar1 < 0) {
    close(local_74);
  }
  if (-1 < local_c) {
    local_c = fd;
  }
  return local_c;
}

Assistant:

int SerialGetMode(int port) {
    char device[80];
    int mode, ret = 0, fd = FindFD(port);

    if (fd < 0)            ///< error
    {
        sprintf(device, "/dev/ttyM%d", port);
#ifdef LINUX
        sprintf( device, "/dev/ttyS%d", port);
        if (port >= PORT2)
            sprintf( device, "/dev/ttyAP%d", port - 1);
#endif
        printf("SerialGetMode device=%s\n", device);
        fd = open(device, O_RDWR | O_NOCTTY);
        if (fd < 0)
            return SERIAL_ERROR_OPEN;
    }

    ret = ioctl(fd, MOXA_GET_OP_MODE, &mode);
    if (FindFD(port) < 0)
        close(fd);

    if (ret < 0)
        return ret;
    return mode;
}